

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O3

void __thiscall MathOp::EQZ_2LTZ::EQZ_2LTZ(EQZ_2LTZ *this,Mat *res,Mat *a,int k)

{
  int r;
  int c;
  Mat *pMVar1;
  LTZ *pLVar2;
  Reveal *pRVar3;
  
  (this->super_Op)._vptr_Op = (_func_int **)&PTR_forward_0012d7d8;
  this->res = res;
  this->a = a;
  this->k = k;
  r = Mat::rows(a);
  c = Mat::cols(a);
  pMVar1 = (Mat *)operator_new(0x28);
  Mat::Mat(pMVar1,r,c);
  this->u_st = pMVar1;
  pMVar1 = (Mat *)operator_new(0x28);
  Mat::Mat(pMVar1,r,c);
  this->u_st_res = pMVar1;
  pMVar1 = (Mat *)operator_new(0x28);
  Mat::Mat(pMVar1,r,c);
  this->u_nd = pMVar1;
  pMVar1 = (Mat *)operator_new(0x28);
  Mat::Mat(pMVar1,r,c);
  this->u_nd_res = pMVar1;
  pLVar2 = (LTZ *)operator_new(0x70);
  LTZ::LTZ(pLVar2,this->u_st_res,this->u_st,0x37);
  this->pLTZ_f_1 = pLVar2;
  pLVar2 = (LTZ *)operator_new(0x70);
  LTZ::LTZ(pLVar2,this->u_nd_res,this->u_nd,0x37);
  this->pLTZ_f_2 = pLVar2;
  pRVar3 = (Reveal *)operator_new(0x40);
  Reveal::Reveal(pRVar3,res,res);
  this->reveal = pRVar3;
  pRVar3 = (Reveal *)operator_new(0x40);
  Reveal::Reveal(pRVar3,this->u_st_res,this->u_st_res);
  this->reveal_1 = pRVar3;
  pRVar3 = (Reveal *)operator_new(0x40);
  Reveal::Reveal(pRVar3,this->u_nd_res,this->u_nd_res);
  this->reveal_2 = pRVar3;
  Op::init(&this->super_Op,(EVP_PKEY_CTX *)0x4);
  return;
}

Assistant:

MathOp::EQZ_2LTZ::EQZ_2LTZ(Mat* res, Mat *a, int k) {
    this->res = res;
    this->a = a;
    this->k = k;
    int tmp_r, tmp_c;
    tmp_r = a->rows();
    tmp_c = a->cols();

    u_st = new Mat(tmp_r, tmp_c);
    u_st_res = new Mat(tmp_r, tmp_c);
    u_nd = new Mat(tmp_r, tmp_c);
    u_nd_res = new Mat(tmp_r, tmp_c);
    pLTZ_f_1 = new LTZ(u_st_res, u_st, BIT_P_LEN);
    pLTZ_f_2 = new LTZ(u_nd_res, u_nd, BIT_P_LEN);
    reveal = new Reveal(res, res);
    reveal_1 = new Reveal(u_st_res, u_st_res);
    reveal_2 = new Reveal(u_nd_res, u_nd_res);
    init(4, 0);
}